

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::ValueExpressionBase::checkVariableAssignment
          (ValueExpressionBase *this,ASTContext *context,VariableSymbol *var,
          bitmask<slang::ast::AssignFlags> flags,SourceLocation assignLoc,SourceRange varRange)

{
  int *piVar1;
  Diagnostic *pDVar2;
  ValueExpressionBase *pVVar3;
  Expression *pEVar4;
  undefined7 in_register_00000009;
  DiagCode DVar5;
  DiagCode code;
  SourceLocation in_R9;
  SourceLocation location;
  bool bVar6;
  SourceRange range;
  SourceRange range_00;
  
  location._1_7_ = in_register_00000009;
  location._0_1_ = flags.m_bits;
  pVVar3 = this;
  if (((ulong)context[6].scope.ptr & 0x100000000) != 0) {
    do {
      piVar1 = *(int **)(*(long *)&pVVar3->super_Expression + 8);
      pVVar3 = (ValueExpressionBase *)(piVar1 + 8);
    } while (*piVar1 == 0x3a);
    pEVar4 = DeclaredType::getInitializer((DeclaredType *)&context[1].lookupIndex);
    code.subsystem = Expressions;
    code.code = 0x18;
    if (((pEVar4 != (Expression *)0x0) || (*piVar1 != 0x40)) ||
       ((*(byte *)(piVar1 + 0x31) & 8) == 0)) goto LAB_003860e9;
  }
  code.subsystem = Expressions;
  code.code = 0x34;
  if ((((ulong)context[6].scope.ptr & 0x1000000000) == 0 || ((ulong)var & 1) != 0) &&
     (((((ulong)var & 1) == 0 || (*(int *)&context[6].scope.ptr != 0)) ||
      (code.subsystem = Expressions, code.code = 0x81, *(int *)&(context->scope).ptr == 0x3f)))) {
    if (*(int *)&(context->scope).ptr == 0x53) {
      if (((ulong)var & 2) != 0) {
        if (((ulong)location & 0xfffffff) == 0) {
          location = assignLoc;
        }
        pDVar2 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x3e0007,location);
        Diagnostic::addNote(pDVar2,(DiagCode)0x50001,(SourceLocation)context->instanceOrProc);
        pDVar2 = Diagnostic::operator<<(pDVar2,*(string_view *)&context->lookupIndex);
        range.endLoc = in_R9;
        range.startLoc = assignLoc;
        Diagnostic::operator<<(pDVar2,range);
      }
      bVar6 = context[6].lookupIndex == 0;
      DVar5.subsystem = Statements;
      DVar5.code = 0x52;
      code.subsystem = Statements;
      code.code = 0xb;
      if (bVar6) {
        code = DVar5;
      }
      if (bVar6 || ((ulong)var & 1) == 0) goto LAB_003860e9;
    }
    code.subsystem = Expressions;
    code.code = 0x5a;
    if (((ulong)var & 0x10) == 0) {
      return true;
    }
  }
LAB_003860e9:
  if (((ulong)location & 0xfffffff) == 0) {
    location = assignLoc;
  }
  pDVar2 = ASTContext::addDiag((ASTContext *)this,code,location);
  Diagnostic::addNote(pDVar2,(DiagCode)0x50001,(SourceLocation)context->instanceOrProc);
  pDVar2 = Diagnostic::operator<<(pDVar2,*(string_view *)&context->lookupIndex);
  range_00.endLoc = in_R9;
  range_00.startLoc = assignLoc;
  Diagnostic::operator<<(pDVar2,range_00);
  return false;
}

Assistant:

bool ValueExpressionBase::checkVariableAssignment(const ASTContext& context,
                                                  const VariableSymbol& var,
                                                  bitmask<AssignFlags> flags,
                                                  SourceLocation assignLoc, SourceRange varRange) {
    auto reportErr = [&](DiagCode code) {
        if (!assignLoc)
            assignLoc = varRange.start();

        auto& diag = context.addDiag(code, assignLoc);
        diag.addNote(diag::NoteDeclarationHere, var.location);
        diag << var.name << varRange;
        return false;
    };

    if (var.flags.has(VariableFlags::Const)) {
        // If we are in a class constructor and this variable does not have an initializer,
        // it's ok to assign to it.
        const Symbol* parent = &context.scope->asSymbol();
        while (parent->kind == SymbolKind::StatementBlock) {
            auto parentScope = parent->getParentScope();
            SLANG_ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (var.getInitializer() || parent->kind != SymbolKind::Subroutine ||
            (parent->as<SubroutineSymbol>().flags & MethodFlags::Constructor) == 0) {
            return reportErr(diag::AssignmentToConstVar);
        }
    }

    if (var.flags.has(VariableFlags::CheckerFreeVariable) && !flags.has(AssignFlags::NonBlocking))
        return reportErr(diag::BlockingAssignToFreeVar);

    if (flags.has(AssignFlags::NonBlocking) && var.lifetime == VariableLifetime::Automatic &&
        var.kind != SymbolKind::ClassProperty) {
        return reportErr(diag::NonblockingAssignmentToAuto);
    }

    if (var.kind == SymbolKind::ClockVar) {
        if (flags.has(AssignFlags::InConcat))
            reportErr(diag::ClockVarAssignConcat);

        auto& cv = var.as<ClockVarSymbol>();
        if (cv.direction == ArgumentDirection::In)
            return reportErr(diag::WriteToInputClockVar);

        if (!flags.has(AssignFlags::NonBlocking))
            return reportErr(diag::ClockVarSyncDrive);
    }

    if (flags.has(AssignFlags::InOutPort))
        return reportErr(diag::InOutVarPortConn);

    return true;
}